

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

token * parse_asm_declarator(dmr_C *C,token *token,decl_state *ctx)

{
  token *ptVar1;
  expression *local_20;
  expression *expr;
  
  ptVar1 = dmrC_expect_token(C,token,0x28,"after asm");
  ptVar1 = dmrC_parse_expression(C,ptVar1->next,&local_20);
  ptVar1 = dmrC_expect_token(C,ptVar1,0x29,"after asm");
  return ptVar1;
}

Assistant:

static struct token *parse_asm_declarator(struct dmr_C *C, struct token *token, struct decl_state *ctx)
{
        (void) ctx;
	struct expression *expr;
	token = dmrC_expect_token(C, token, '(', "after asm");
	token = dmrC_parse_expression(C, token->next, &expr);
	token = dmrC_expect_token(C, token, ')', "after asm");
	return token;
}